

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_NtkDelayTraceCritPathCollect_rec
               (Vec_Int_t *vSlacks,Abc_Obj_t *pNode,Vec_Int_t *vBest,Vec_Ptr_t *vPath)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  
  uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
  if ((uVar2 != 2) && (uVar2 != 5)) {
    if (uVar2 != 7) {
      __assert_fail("Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x36c,
                    "void Abc_NtkDelayTraceCritPathCollect_rec(Vec_Int_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Ptr_t *)"
                   );
    }
    iVar1 = pNode->Id;
    if (((long)iVar1 < 0) || (vBest->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((long)vBest->pArray[iVar1] < 0) {
      __assert_fail("iFanin >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x370,
                    "void Abc_NtkDelayTraceCritPathCollect_rec(Vec_Int_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Ptr_t *)"
                   );
    }
    Abc_NtkDelayTraceCritPathCollect_rec
              (vSlacks,(Abc_Obj_t *)
                       pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[vBest->pArray[iVar1]]],
               vBest,vPath);
  }
  uVar2 = vPath->nSize;
  if (uVar2 == vPath->nCap) {
    if ((int)uVar2 < 0x10) {
      if (vPath->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vPath->pArray,0x80);
      }
      vPath->pArray = ppvVar3;
      vPath->nCap = 0x10;
    }
    else {
      if (vPath->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vPath->pArray,(ulong)uVar2 << 4);
      }
      vPath->pArray = ppvVar3;
      vPath->nCap = uVar2 * 2;
    }
  }
  else {
    ppvVar3 = vPath->pArray;
  }
  iVar1 = vPath->nSize;
  vPath->nSize = iVar1 + 1;
  ppvVar3[iVar1] = pNode;
  return;
}

Assistant:

void Abc_NtkDelayTraceCritPathCollect_rec( Vec_Int_t * vSlacks, Abc_Obj_t * pNode, Vec_Int_t * vBest, Vec_Ptr_t * vPath )
{
    assert( Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode) );
    if ( Abc_ObjIsNode(pNode) )
    {
        int iFanin = Vec_IntEntry( vBest, Abc_ObjId(pNode) );
        assert( iFanin >= 0 );
        Abc_NtkDelayTraceCritPathCollect_rec( vSlacks, Abc_ObjFanin(pNode, iFanin), vBest, vPath );
    }
    Vec_PtrPush( vPath, pNode );
}